

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

bool __thiscall ExternalTester::Test(ExternalTester *this,TestList test)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  char *pcVar9;
  char *pcVar10;
  
  poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "---------------------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "       Tasmanian Sparse Grids Module: Functionality Test");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "---------------------------------------------------------------------");
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  bVar2 = true;
  bVar1 = true;
  if (test < test_domain) {
    bVar1 = testAllAcceleration(this);
  }
  if ((test & ~test_domain) == test_all) {
    bVar2 = testAllDomain(this);
  }
  if ((test == test_refinement) || (bVar3 = true, test == test_all)) {
    bVar3 = testAllRefinement(this);
  }
  bVar5 = true;
  bVar4 = true;
  if ((test & ~test_global) == test_all) {
    bVar4 = testAllGlobal(this);
  }
  if ((test == test_local) || (test == test_all)) {
    bVar5 = testAllPWLocal(this);
  }
  if ((test == test_wavelet) || (bVar6 = true, test == test_all)) {
    bVar6 = testAllWavelet(this);
  }
  if ((test == test_fourier) || (bVar7 = true, test == test_all)) {
    bVar7 = testAllFourier(this);
  }
  bVar1 = (bool)(bVar1 & bVar2 & bVar3 & bVar4 & bVar5 & bVar6 & bVar7);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pcVar9 = "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL";
  if (bVar1 != false) {
    pcVar9 = "---------------------------------------------------------------------";
  }
  pcVar10 = "         Some Tests Have Failed";
  if (bVar1 != false) {
    pcVar10 = "           All Tests Completed Successfully";
  }
  poVar8 = std::operator<<((ostream *)&std::cout,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,pcVar9);
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  return bVar1;
}

Assistant:

bool ExternalTester::Test(TestList test) const{
    cout << endl << endl;
    cout << "---------------------------------------------------------------------" << endl;
    cout << "       Tasmanian Sparse Grids Module: Functionality Test" << endl;
    cout << "---------------------------------------------------------------------" << endl << endl;

    bool passAccel   = true;
    bool passDomain  = true;
    bool passRefine  = true;
    bool passGlobal  = true;
    bool passLocal   = true;
    bool passWavelet = true;
    bool passFourier = true;

    if ((test == test_all) || (test == test_acceleration)) passAccel   = testAllAcceleration();
    if ((test == test_all) || (test == test_domain))       passDomain  = testAllDomain();
    if ((test == test_all) || (test == test_refinement))   passRefine  = testAllRefinement();
    if ((test == test_all) || (test == test_global))       passGlobal  = testAllGlobal();
    if ((test == test_all) || (test == test_local))        passLocal   = testAllPWLocal();
    if ((test == test_all) || (test == test_wavelet))      passWavelet = testAllWavelet();
    if ((test == test_all) || (test == test_fourier))      passFourier = testAllFourier();

    bool pass = passGlobal && passLocal && passWavelet && passFourier && passRefine && passDomain && passAccel;
    //bool pass = true;

    cout << endl;
    if (pass){
        cout << "---------------------------------------------------------------------" << endl;
        cout << "           All Tests Completed Successfully" << endl;
        cout << "---------------------------------------------------------------------" << endl << endl;
    }else{
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl;
        cout << "         Some Tests Have Failed" << endl;
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl << endl;
    }
    return pass;
}